

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

bool InitHTTPServer(SignalInterrupt *interrupt)

{
  string *fmt;
  long lVar1;
  DNSLookupFn dns_lookup_function;
  DNSLookupFn dns_lookup_function_00;
  string original;
  DNSLookupFn dns_lookup_function_01;
  pointer pCVar2;
  pointer ppeVar3;
  pointer ppeVar4;
  _Alloc_hider __p;
  bool bVar5;
  int iVar6;
  Logger *this;
  tuple<evhttp_*,_evhttp_deleter> tVar7;
  ulong uVar8;
  CBaseChainParams *pCVar9;
  int64_t iVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pointer pcVar11;
  pointer pbVar12;
  pointer this_00;
  bilingual_str *fmt_00;
  undefined8 name;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view in;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  char *pcVar13;
  string *psVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  undefined8 uStack_198;
  uint16_t http_port;
  undefined6 uStack_18e;
  bilingual_str *local_188;
  raii_event_base base_ctr;
  uint16_t port;
  undefined6 uStack_156;
  string local_138;
  raii_evhttp http_ctr;
  int workQueueDepth;
  undefined4 uStack_f4;
  undefined8 local_f0;
  string strAllowed;
  bool local_98;
  CSubNet subnet;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CSubNet,_std::allocator<CSubNet>_>::clear(&rpc_allow_subnets);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&workQueueDepth,"127.0.0.1",(allocator<char> *)&local_138);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&port,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffe60;
  dns_lookup_function.super__Function_base._M_functor._M_unused._M_object =
       in_stack_fffffffffffffe58;
  dns_lookup_function.super__Function_base._M_manager = (_Manager_type)uStack_198;
  dns_lookup_function._M_invoker._0_2_ = http_port;
  dns_lookup_function._M_invoker._2_6_ = uStack_18e;
  LookupHost((optional<CNetAddr> *)&strAllowed,(string *)&workQueueDepth,false,dns_lookup_function);
  if (local_98 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    subnet.network.m_addr._union._0_4_ = 8;
    std::vector<CSubNet,std::allocator<CSubNet>>::emplace_back<CNetAddr,int>
              ((vector<CSubNet,std::allocator<CSubNet>> *)&rpc_allow_subnets,(CNetAddr *)&strAllowed
               ,(int *)&subnet);
    std::_Optional_payload_base<CNetAddr>::_M_reset((_Optional_payload_base<CNetAddr> *)&strAllowed)
    ;
    std::_Function_base::~_Function_base((_Function_base *)&port);
    std::__cxx11::string::~string((string *)&workQueueDepth);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&workQueueDepth,"::1",(allocator<char> *)&subnet);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&base_ctr,&g_dns_lookup_abi_cxx11_);
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base_ctr;
    dns_lookup_function_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffe60;
    dns_lookup_function_00.super__Function_base._M_functor._M_unused._M_object =
         in_stack_fffffffffffffe58;
    dns_lookup_function_00.super__Function_base._M_manager = (_Manager_type)uStack_198;
    dns_lookup_function_00._M_invoker._0_2_ = http_port;
    dns_lookup_function_00._M_invoker._2_6_ = uStack_18e;
    LookupHost((optional<CNetAddr> *)&strAllowed,(string *)&workQueueDepth,false,
               dns_lookup_function_00);
    if (local_98 != false) {
      std::vector<CSubNet,_std::allocator<CSubNet>_>::emplace_back<CNetAddr>
                (&rpc_allow_subnets,(CNetAddr *)&strAllowed);
      std::_Optional_payload_base<CNetAddr>::_M_reset
                ((_Optional_payload_base<CNetAddr> *)&strAllowed);
      std::_Function_base::~_Function_base((_Function_base *)&base_ctr);
      std::__cxx11::string::~string((string *)&workQueueDepth);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&strAllowed,"-rpcallowip",(allocator<char> *)&workQueueDepth);
      ArgsManager::GetArgs
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&http_port,&gArgs,&strAllowed);
      std::__cxx11::string::~string((string *)&strAllowed);
      fmt_00 = (bilingual_str *)CONCAT62(uStack_18e,http_port);
LAB_003c8bbe:
      if (fmt_00 != local_188) goto LAB_003c8bc7;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&http_port);
      pCVar2 = rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
               super__Vector_impl_data._M_finish;
      strAllowed._M_dataplus._M_p = (pointer)&strAllowed.field_2;
      strAllowed._M_string_length = 0;
      strAllowed.field_2._M_local_buf[0] = '\0';
      for (this_00 = rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl
                     .super__Vector_impl_data._M_start; this_00 != pCVar2; this_00 = this_00 + 1) {
        CSubNet::ToString_abi_cxx11_((string *)&subnet,this_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &workQueueDepth,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subnet,
                       " ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&strAllowed,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &workQueueDepth);
        std::__cxx11::string::~string((string *)&workQueueDepth);
        std::__cxx11::string::~string((string *)&subnet);
      }
      pcVar13 = (char *)0x3c8d52;
      bVar5 = LogAcceptCategory(HTTP,Debug);
      if (bVar5) {
        logging_function._M_str = "InitHTTPAllowList";
        logging_function._M_len = 0x11;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
        ;
        source_file._M_len = 0x57;
        LogPrintf_<std::__cxx11::string>
                  (logging_function,source_file,0xee,
                   I2P|VALIDATION|QT|COINDB|LIBEVENT|RAND|WALLETDB|ZMQ|HTTP|MEMPOOL|NET,
                   (Level)&strAllowed,pcVar13,in_stack_fffffffffffffe58);
      }
      std::__cxx11::string::~string((string *)&strAllowed);
      event_set_log_callback(libevent_log_cb);
      this = LogInstance();
      bVar5 = BCLog::Logger::WillLogCategory(this,LIBEVENT);
      UpdateHTTPServerLogging(bVar5);
      evthread_use_pthreads();
      obtain_event_base();
      tVar7.super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.super__Head_base<0UL,_evhttp_*,_false>.
      _M_head_impl = (_Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>)
                     evhttp_new(base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>.
                                _M_t.super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
                                super__Head_base<0UL,_event_base_*,_false>._M_head_impl);
      http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
      super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.super__Head_base<0UL,_evhttp_*,_false>.
      _M_head_impl = (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)
                     (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)
                     tVar7.super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                     super__Head_base<0UL,_evhttp_*,_false>._M_head_impl;
      if (tVar7.super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
          super__Head_base<0UL,_evhttp_*,_false>._M_head_impl ==
          (_Head_base<0UL,_evhttp_*,_false>)0x0) {
        pcVar13 = "couldn\'t create evhttp. Exiting.\n";
        iVar6 = 0x1c7;
LAB_003c94ab:
        logging_function_08._M_str = "InitHTTPServer";
        logging_function_08._M_len = 0xe;
        source_file_08._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
        ;
        source_file_08._M_len = 0x57;
        LogPrintf_<>(logging_function_08,source_file_08,iVar6,ALL,Info,pcVar13);
        bVar5 = false;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&strAllowed,"-rpcservertimeout",(allocator<char> *)&workQueueDepth);
        uVar8 = ArgsManager::GetIntArg(&gArgs,&strAllowed,0x1e);
        evhttp_set_timeout(tVar7.super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                           super__Head_base<0UL,_evhttp_*,_false>._M_head_impl,uVar8 & 0xffffffff);
        std::__cxx11::string::~string((string *)&strAllowed);
        evhttp_set_max_headers_size
                  (tVar7.super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                   super__Head_base<0UL,_evhttp_*,_false>._M_head_impl,0x2000);
        evhttp_set_max_body_size
                  (tVar7.super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                   super__Head_base<0UL,_evhttp_*,_false>._M_head_impl,0x2000000);
        evhttp_set_gencb(tVar7.super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                         super__Head_base<0UL,_evhttp_*,_false>._M_head_impl,http_request_cb,
                         interrupt);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&strAllowed,"-rpcport",(allocator<char> *)&workQueueDepth);
        pCVar9 = BaseParams();
        iVar10 = ArgsManager::GetIntArg(&gArgs,&strAllowed,(ulong)pCVar9->m_rpc_port);
        std::__cxx11::string::~string((string *)&strAllowed);
        http_port = (uint16_t)iVar10;
        subnet.network.m_addr._union.indirect_contents.indirect = (char *)0x0;
        subnet.network.m_addr._union._8_8_ = 0;
        subnet.network.m_addr._size = 0;
        subnet.network.m_addr._20_4_ = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&strAllowed,"-rpcallowip",(allocator<char> *)&port);
        bVar5 = ArgsManager::IsArgSet(&gArgs,&strAllowed);
        if (bVar5) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&workQueueDepth,"-rpcbind",(allocator<char> *)&local_138);
          bVar5 = ArgsManager::IsArgSet(&gArgs,(string *)&workQueueDepth);
          std::__cxx11::string::~string((string *)&workQueueDepth);
          std::__cxx11::string::~string((string *)&strAllowed);
          if (!bVar5) goto LAB_003c906f;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&strAllowed,"-rpcbind",(allocator<char> *)&workQueueDepth);
          bVar5 = ArgsManager::IsArgSet(&gArgs,&strAllowed);
          std::__cxx11::string::~string((string *)&strAllowed);
          name = subnet.network.m_addr._union.indirect_contents.indirect;
          if (bVar5) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&strAllowed,"-rpcbind",(allocator<char> *)&port);
            ArgsManager::GetArgs
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&workQueueDepth,&gArgs,&strAllowed);
            std::__cxx11::string::~string((string *)&strAllowed);
            for (pbVar12 = (pointer)CONCAT44(uStack_f4,workQueueDepth); pbVar12 != (pointer)local_f0
                ; pbVar12 = pbVar12 + 1) {
              strAllowed._M_dataplus._M_p = (pointer)&strAllowed.field_2;
              strAllowed._M_string_length = 0;
              port = http_port;
              strAllowed.field_2._M_local_buf[0] = '\0';
              in._M_str = (pbVar12->_M_dataplus)._M_p;
              in._M_len = pbVar12->_M_string_length;
              SplitHostPort(in,&port,&strAllowed);
              std::
              vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
              ::emplace_back<std::__cxx11::string&,unsigned_short&>
                        ((vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
                          *)&subnet,&strAllowed,&port);
              std::__cxx11::string::~string((string *)&strAllowed);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&workQueueDepth);
            name = subnet.network.m_addr._union.indirect_contents.indirect;
          }
        }
        else {
          std::__cxx11::string::~string((string *)&strAllowed);
LAB_003c906f:
          std::
          vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
          ::emplace_back<char_const(&)[4],unsigned_short&>
                    ((vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
                      *)&subnet,(char (*) [4])"::1",&http_port);
          std::
          vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
          ::emplace_back<char_const(&)[10],unsigned_short&>
                    ((vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
                      *)&subnet,(char (*) [10])"127.0.0.1",&http_port);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&strAllowed,"-rpcallowip",(allocator<char> *)&workQueueDepth);
          bVar5 = ArgsManager::IsArgSet(&gArgs,&strAllowed);
          std::__cxx11::string::~string((string *)&strAllowed);
          if (bVar5) {
            logging_function_00._M_str = "HTTPBindAddresses";
            logging_function_00._M_len = 0x11;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
            ;
            source_file_00._M_len = 0x57;
            LogPrintf_<>(logging_function_00,source_file_00,0x170,ALL,Info,
                         "WARNING: option -rpcallowip was specified without -rpcbind; this doesn\'t usually make sense\n"
                        );
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&strAllowed,"-rpcbind",(allocator<char> *)&workQueueDepth);
          bVar5 = ArgsManager::IsArgSet(&gArgs,&strAllowed);
          std::__cxx11::string::~string((string *)&strAllowed);
          name = subnet.network.m_addr._union.indirect_contents.indirect;
          if (bVar5) {
            logging_function_01._M_str = "HTTPBindAddresses";
            logging_function_01._M_len = 0x11;
            source_file_01._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
            ;
            source_file_01._M_len = 0x57;
            LogPrintf_<>(logging_function_01,source_file_01,0x173,ALL,Info,
                         "WARNING: option -rpcbind was ignored because -rpcallowip was not specified, refusing to allow everyone to connect\n"
                        );
            name = subnet.network.m_addr._union.indirect_contents.indirect;
          }
        }
        for (; ppeVar4 = boundSockets.
                         super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
            ppeVar3 = boundSockets.
                      super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            name != subnet.network.m_addr._union._8_8_;
            name = &((string *)(name + 0x20))->_M_string_length) {
          fmt = (string *)(name + 0x20);
          logging_function_02._M_str = "HTTPBindAddresses";
          logging_function_02._M_len = 0x11;
          source_file_02._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
          ;
          source_file_02._M_len = 0x57;
          psVar14 = fmt;
          LogPrintf_<std::__cxx11::string,unsigned_short>
                    (logging_function_02,source_file_02,0x180,
                     I2P|VALIDATION|QT|COINDB|LIBEVENT|RAND|ADDRMAN|ESTIMATEFEE|RPC|MEMPOOL|NET,
                     (Level)name,(char *)fmt,in_stack_fffffffffffffe58,(unsigned_short *)interrupt);
          if (((string *)name)->_M_string_length == 0) {
            pcVar11 = (pointer)0x0;
          }
          else {
            pcVar11 = (((string *)name)->_M_dataplus)._M_p;
          }
          _port = evhttp_bind_socket_with_handle
                            (tVar7.super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                             super__Head_base<0UL,_evhttp_*,_false>._M_head_impl,pcVar11,
                             *(undefined2 *)&(fmt->_M_dataplus)._M_p,psVar14);
          if ((void *)_port == (void *)0x0) {
            logging_function_05._M_str = "HTTPBindAddresses";
            logging_function_05._M_len = 0x11;
            source_file_05._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
            ;
            source_file_05._M_len = 0x57;
            LogPrintf_<std::__cxx11::string,unsigned_short>
                      (logging_function_05,source_file_05,399,
                       I2P|VALIDATION|QT|COINDB|LIBEVENT|RAND|SELECTCOINS|WALLETDB|BENCH|MEMPOOL|NET
                       ,(Level)name,(char *)fmt,in_stack_fffffffffffffe58,
                       (unsigned_short *)interrupt);
          }
          else {
            std::
            function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
            ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                        *)&workQueueDepth,&g_dns_lookup_abi_cxx11_);
            dns_lookup_function_01.super__Function_base._M_functor._8_8_ = interrupt;
            dns_lookup_function_01.super__Function_base._M_functor._M_unused._M_object =
                 in_stack_fffffffffffffe58;
            dns_lookup_function_01.super__Function_base._M_manager = (_Manager_type)uStack_198;
            dns_lookup_function_01._M_invoker._0_2_ = http_port;
            dns_lookup_function_01._M_invoker._2_6_ = uStack_18e;
            LookupHost((optional<CNetAddr> *)&strAllowed,(string *)name,false,dns_lookup_function_01
                      );
            std::_Function_base::~_Function_base((_Function_base *)&workQueueDepth);
            if ((((string *)name)->_M_string_length == 0) ||
               ((local_98 == true && (bVar5 = CNetAddr::IsBindAny((CNetAddr *)&strAllowed), bVar5)))
               ) {
              logging_function_03._M_str = "HTTPBindAddresses";
              logging_function_03._M_len = 0x11;
              source_file_03._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
              ;
              source_file_03._M_len = 0x57;
              LogPrintf_<>(logging_function_03,source_file_03,0x185,ALL,Info,
                           "WARNING: the RPC server is not safe to expose to untrusted networks such as the public internet\n"
                          );
            }
            iVar6 = evhttp_bound_socket_get_fd(_port);
            local_138._M_dataplus._M_p._0_4_ = 1;
            iVar6 = setsockopt(iVar6,6,1,&local_138,4);
            if (iVar6 == -1) {
              logging_function_04._M_str = "HTTPBindAddresses";
              logging_function_04._M_len = 0x11;
              source_file_04._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
              ;
              source_file_04._M_len = 0x57;
              LogPrintf_<>(logging_function_04,source_file_04,0x18b,ALL,Info,
                           "WARNING: Unable to set TCP_NODELAY on RPC server socket, continuing anyway\n"
                          );
            }
            std::vector<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>::push_back
                      (&boundSockets,(value_type *)&port);
            std::_Optional_payload_base<CNetAddr>::_M_reset
                      ((_Optional_payload_base<CNetAddr> *)&strAllowed);
          }
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                   *)&subnet);
        if (ppeVar3 == ppeVar4) {
          pcVar13 = "Unable to bind any endpoint for RPC server\n";
          iVar6 = 0x1d1;
          goto LAB_003c94ab;
        }
        bVar5 = LogAcceptCategory(HTTP,Debug);
        if (bVar5) {
          logging_function_06._M_str = "InitHTTPServer";
          logging_function_06._M_len = 0xe;
          source_file_06._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
          ;
          source_file_06._M_len = 0x57;
          LogPrintf_<>(logging_function_06,source_file_06,0x1d5,HTTP,Debug,
                       "Initialized HTTP server\n");
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&strAllowed,"-rpcworkqueue",(allocator<char> *)&subnet);
        iVar10 = ArgsManager::GetIntArg(&gArgs,&strAllowed,0x10);
        workQueueDepth = 1;
        if (1 < iVar10) {
          workQueueDepth = (int)iVar10;
        }
        std::__cxx11::string::~string((string *)&strAllowed);
        bVar5 = LogAcceptCategory(HTTP,Debug);
        if (bVar5) {
          logging_function_07._M_str = "InitHTTPServer";
          logging_function_07._M_len = 0xe;
          source_file_07._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
          ;
          source_file_07._M_len = 0x57;
          LogPrintf_<int>(logging_function_07,source_file_07,0x1d7,HTTP,Debug,
                          "creating work queue of depth %d\n",&workQueueDepth);
        }
        std::make_unique<WorkQueue<HTTPClosure>,int&>((int *)&strAllowed);
        __p = strAllowed._M_dataplus;
        strAllowed._M_dataplus._M_p = (pointer)0x0;
        std::__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
        ::reset((__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                 *)&g_work_queue,(pointer)__p._M_p);
        std::unique_ptr<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>::
        ~unique_ptr((unique_ptr<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                     *)&strAllowed);
        eventHTTP = (evhttp *)http_ctr;
        eventBase = (event_base *)base_ctr;
        base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
        super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
        super__Head_base<0UL,_event_base_*,_false>._M_head_impl =
             (__uniq_ptr_data<event_base,_event_base_deleter,_true,_true>)
             (__uniq_ptr_impl<event_base,_event_base_deleter>)0x0;
        http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
        super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.super__Head_base<0UL,_evhttp_*,_false>.
        _M_head_impl = (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)
                       (__uniq_ptr_impl<evhttp,_evhttp_deleter>)0x0;
        bVar5 = true;
      }
      std::unique_ptr<evhttp,_evhttp_deleter>::~unique_ptr(&http_ctr);
      std::unique_ptr<event_base,_event_base_deleter>::~unique_ptr(&base_ctr);
      goto LAB_003c94e6;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
LAB_003c9860:
  __stack_chk_fail();
LAB_003c8bc7:
  LookupSubNet(&subnet,&fmt_00->original);
  bVar5 = CSubNet::IsValid(&subnet);
  if (bVar5) {
    std::vector<CSubNet,_std::allocator<CSubNet>_>::push_back(&rpc_allow_subnets,&subnet);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&http_ctr,
               "Invalid -rpcallowip subnet specification: %s. Valid are a single IP (e.g. 1.2.3.4), a network/netmask (e.g. 1.2.3.4/255.255.255.0) or a network/CIDR (e.g. 1.2.3.4/24)."
               ,(allocator<char> *)((long)&uStack_198 + 7));
    original._M_string_length = (size_type)interrupt;
    original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
    original.field_2._M_allocated_capacity = uStack_198;
    original.field_2._8_2_ = http_port;
    original.field_2._10_6_ = uStack_18e;
    Untranslated((bilingual_str *)&workQueueDepth,original);
    tinyformat::format<std::__cxx11::string>
              ((bilingual_str *)&strAllowed,(tinyformat *)&workQueueDepth,fmt_00,args);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"",(allocator<char> *)((long)&uStack_198 + 6));
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10000402;
    CClientUIInterface::ThreadSafeMessageBox
              ((CClientUIInterface *)&uiInterface,(bilingual_str *)&strAllowed,&local_138,0x10000402
              );
    std::__cxx11::string::~string((string *)&local_138);
    bilingual_str::~bilingual_str((bilingual_str *)&strAllowed);
    bilingual_str::~bilingual_str((bilingual_str *)&workQueueDepth);
    std::__cxx11::string::~string((string *)&http_ctr);
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  fmt_00 = (bilingual_str *)&fmt_00->translated;
  if (!bVar5) goto code_r0x003c8cac;
  goto LAB_003c8bbe;
code_r0x003c8cac:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&http_port);
  bVar5 = false;
LAB_003c94e6:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar5;
  }
  goto LAB_003c9860;
}

Assistant:

bool InitHTTPServer(const util::SignalInterrupt& interrupt)
{
    if (!InitHTTPAllowList())
        return false;

    // Redirect libevent's logging to our own log
    event_set_log_callback(&libevent_log_cb);
    // Update libevent's log handling.
    UpdateHTTPServerLogging(LogInstance().WillLogCategory(BCLog::LIBEVENT));

#ifdef WIN32
    evthread_use_windows_threads();
#else
    evthread_use_pthreads();
#endif

    raii_event_base base_ctr = obtain_event_base();

    /* Create a new evhttp object to handle requests. */
    raii_evhttp http_ctr = obtain_evhttp(base_ctr.get());
    struct evhttp* http = http_ctr.get();
    if (!http) {
        LogPrintf("couldn't create evhttp. Exiting.\n");
        return false;
    }

    evhttp_set_timeout(http, gArgs.GetIntArg("-rpcservertimeout", DEFAULT_HTTP_SERVER_TIMEOUT));
    evhttp_set_max_headers_size(http, MAX_HEADERS_SIZE);
    evhttp_set_max_body_size(http, MAX_SIZE);
    evhttp_set_gencb(http, http_request_cb, (void*)&interrupt);

    if (!HTTPBindAddresses(http)) {
        LogPrintf("Unable to bind any endpoint for RPC server\n");
        return false;
    }

    LogDebug(BCLog::HTTP, "Initialized HTTP server\n");
    int workQueueDepth = std::max((long)gArgs.GetIntArg("-rpcworkqueue", DEFAULT_HTTP_WORKQUEUE), 1L);
    LogDebug(BCLog::HTTP, "creating work queue of depth %d\n", workQueueDepth);

    g_work_queue = std::make_unique<WorkQueue<HTTPClosure>>(workQueueDepth);
    // transfer ownership to eventBase/HTTP via .release()
    eventBase = base_ctr.release();
    eventHTTP = http_ctr.release();
    return true;
}